

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinEPC18_2>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps,
               host_buffer_type vxc)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar1 = rho[uVar2];
      dVar3 = 0.0;
      dVar4 = 0.0;
      if (1e-24 < dVar1) {
        dVar3 = (dVar1 * dVar1 * 0.96 - (dVar1 + dVar1)) + 3.9;
        dVar4 = 0.0;
        if (1e-24 < dVar1 * 0.5) {
          dVar4 = (dVar1 * 1.92 + -2.0) * (1.0 / (dVar3 * dVar3)) * dVar1 * 0.25 -
                  (1.0 / dVar3) * 0.25;
        }
        dVar3 = (double)(~-(ulong)(dVar1 * 0.5 <= 1e-24) & (ulong)((1.0 / dVar3) * -dVar1 * 0.25));
        dVar4 = dVar4 * dVar1 + dVar3;
      }
      eps[uVar2] = dVar3 * scal_fact + eps[uVar2];
      vxc[uVar2] = dVar4 * scal_fact + vxc[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  return;
}

Assistant:

LDA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double v,e;
    traits::eval_exc_vxc_unpolar( rho[i], e, v );
    eps[i] += scal_fact * e;
    vxc[i] += scal_fact * v;

  }

}